

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::FieldDescriptorProto(FieldDescriptorProto *this)

{
  Arena *in_RDI;
  Message *in_stack_ffffffffffffffd0;
  FieldDescriptorProto *this_00;
  
  Message::Message(in_stack_ffffffffffffffd0);
  (in_RDI->impl_).threads_._M_b._M_p = (__pointer_type)&PTR__FieldDescriptorProto_009674b0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)&(in_RDI->impl_).hint_,in_RDI);
  this_00 = (FieldDescriptorProto *)&(in_RDI->impl_).space_allocated_;
  memset(this_00,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x515f9e);
  SharedCtor(this_00);
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.FieldDescriptorProto)
}